

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O2

void __thiscall server::captureservmode::baseinfo::reset(baseinfo *this)

{
  this->enemy[0] = '\0';
  this->owner[0] = '\0';
  this->ammogroup = 0;
  this->ammotype = 0;
  this->tag = -1;
  this->ammo = 0;
  this->owners = 0;
  this->enemies = 0;
  this->converted = 0;
  this->capturetime = -1;
  return;
}

Assistant:

void reset()
        {
            noenemy();
            owner[0] = '\0';
            capturetime = -1;
            ammogroup = 0;
            ammotype = 0;
            tag = -1;
            ammo = 0;
            owners = 0;
        }